

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O0

Node48 * duckdb::Node48::ShrinkNode256(ART *art,Node *node48,Node *node256)

{
  bool bVar1;
  byte bVar2;
  Node48 *pNVar3;
  Node256 *pNVar4;
  IndexPointer *in_RDX;
  Node *in_RSI;
  uint8_t i_1;
  uint16_t i;
  Node256 *n256;
  Node48 *n48;
  GateStatus in_stack_ffffffffffffffbf;
  undefined8 in_stack_ffffffffffffffc0;
  NType type;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined2 in_stack_ffffffffffffffce;
  ushort uVar5;
  IndexPointer ptr;
  Node *in_stack_ffffffffffffffd8;
  ART *in_stack_ffffffffffffffe0;
  
  type = (NType)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  pNVar3 = New(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ptr.data = in_RDX->data;
  pNVar4 = Node::Ref<duckdb::Node256>
                     ((ART *)CONCAT26(in_stack_ffffffffffffffce,
                                      CONCAT15(in_stack_ffffffffffffffcd,in_stack_ffffffffffffffc8))
                      ,(Node)ptr.data,type);
  Node::GetGateStatus(in_RSI);
  Node::SetGateStatus(in_RSI,in_stack_ffffffffffffffbf);
  pNVar3->count = '\0';
  for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 1) {
    bVar1 = IndexPointer::HasMetadata(&pNVar4->children[uVar5].super_IndexPointer);
    if (bVar1) {
      pNVar3->child_index[uVar5] = pNVar3->count;
      pNVar3->children[pNVar3->count].super_IndexPointer.data =
           pNVar4->children[uVar5].super_IndexPointer.data;
      pNVar3->count = pNVar3->count + '\x01';
    }
    else {
      pNVar3->child_index[uVar5] = '0';
    }
  }
  for (bVar2 = pNVar3->count; bVar2 < 0x30; bVar2 = bVar2 + 1) {
    IndexPointer::Clear(&pNVar3->children[bVar2].super_IndexPointer);
  }
  pNVar4->count = 0;
  Node::Free((ART *)ptr.data,(Node *)CONCAT26(uVar5,CONCAT15(bVar2,in_stack_ffffffffffffffc8)));
  return pNVar3;
}

Assistant:

Node48 &Node48::ShrinkNode256(ART &art, Node &node48, Node &node256) {
	auto &n48 = New(art, node48);
	auto &n256 = Node::Ref<Node256>(art, node256, NType::NODE_256);
	node48.SetGateStatus(node256.GetGateStatus());

	n48.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (!n256.children[i].HasMetadata()) {
			n48.child_index[i] = EMPTY_MARKER;
			continue;
		}
		n48.child_index[i] = n48.count;
		n48.children[n48.count] = n256.children[i];
		n48.count++;
	}
	for (uint8_t i = n48.count; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	n256.count = 0;
	Node::Free(art, node256);
	return n48;
}